

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O2

shared_ptr<chaiscript::Boxed_Value::Data>
chaiscript::Boxed_Value::Object_Data::get<std::logic_error_const>
          (reference_wrapper<const_std::logic_error> obj,bool t_return_value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  element_type *in_RDI;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar2;
  logic_error *p;
  undefined1 local_5a [2];
  Any local_58;
  bool local_50 [8];
  reference_wrapper<const_std::logic_error> local_48;
  Any local_40;
  undefined *local_38;
  undefined4 local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_40.m_data._M_t.
  super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
  ._M_t.
  super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
  .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl =
       (unique_ptr<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
        )&std::logic_error::typeinfo;
  local_38 = &std::logic_error::typeinfo;
  local_30 = 1;
  detail::Any::Any<std::reference_wrapper<std::logic_error_const>,void>(&local_58,&local_48);
  local_5a[0] = 1;
  sVar2 = std::
          make_shared<chaiscript::Boxed_Value::Data,chaiscript::Type_Info,chaiscript::detail::Any,bool,std::logic_error_const*&,bool&>
                    (&in_RDI->m_type_info,&local_40,(bool *)&local_58,(logic_error **)local_5a,
                     local_50);
  _Var1 = sVar2.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_58.m_data._M_t.
      super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
      ._M_t.
      super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
      .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>._M_head_impl !=
      (__uniq_ptr_data<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_58.m_data._M_t.
                          super___uniq_ptr_impl<chaiscript::detail::Any::Data,_std::default_delete<chaiscript::detail::Any::Data>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_chaiscript::detail::Any::Data_*,_std::default_delete<chaiscript::detail::Any::Data>_>
                          .super__Head_base<0UL,_chaiscript::detail::Any::Data_*,_false>.
                          _M_head_impl + 8))();
    _Var1._M_pi = extraout_RDX;
  }
  sVar2.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var1._M_pi;
  sVar2.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar2.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(std::reference_wrapper<T> obj, bool t_return_value) {
        auto p = &obj.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(), chaiscript::detail::Any(std::move(obj)), true, p, t_return_value);
      }